

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

CURLcode req_send_buffer_flush(Curl_easy *data)

{
  _Bool _Var1;
  ulong local_48;
  ulong local_40;
  size_t hds_len;
  size_t nwritten;
  size_t blen;
  uchar *buf;
  Curl_easy *pCStack_10;
  CURLcode result;
  Curl_easy *data_local;
  
  buf._4_4_ = CURLE_OK;
  pCStack_10 = data;
  while( true ) {
    _Var1 = Curl_bufq_peek(&(pCStack_10->req).sendbuf,(uchar **)&blen,&nwritten);
    if (!_Var1) {
      return buf._4_4_;
    }
    if ((pCStack_10->req).sendbuf_hds_len < nwritten) {
      local_40 = (pCStack_10->req).sendbuf_hds_len;
    }
    else {
      local_40 = nwritten;
    }
    buf._4_4_ = xfer_send(pCStack_10,(char *)blen,nwritten,local_40,&hds_len);
    if (buf._4_4_ != CURLE_OK) break;
    Curl_bufq_skip(&(pCStack_10->req).sendbuf,hds_len);
    if (local_40 != 0) {
      if (local_40 < hds_len) {
        local_48 = local_40;
      }
      else {
        local_48 = hds_len;
      }
      (pCStack_10->req).sendbuf_hds_len = (pCStack_10->req).sendbuf_hds_len - local_48;
    }
    if (hds_len < nwritten) {
      return buf._4_4_;
    }
  }
  return buf._4_4_;
}

Assistant:

static CURLcode req_send_buffer_flush(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  const unsigned char *buf;
  size_t blen;

  while(Curl_bufq_peek(&data->req.sendbuf, &buf, &blen)) {
    size_t nwritten, hds_len = CURLMIN(data->req.sendbuf_hds_len, blen);
    result = xfer_send(data, (const char *)buf, blen, hds_len, &nwritten);
    if(result)
      break;

    Curl_bufq_skip(&data->req.sendbuf, nwritten);
    if(hds_len) {
      data->req.sendbuf_hds_len -= CURLMIN(hds_len, nwritten);
    }
    /* leave if we could not send all. Maybe network blocking or
     * speed limits on transfer */
    if(nwritten < blen)
      break;
  }
  return result;
}